

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
          (ConvolutionLayerParams *this)

{
  ConvolutionPaddingTypeCase CVar1;
  ConvolutionLayerParams *this_local;
  
  CVar1 = ConvolutionPaddingType_case(this);
  if (CVar1 != CONVOLUTIONPADDINGTYPE_NOT_SET) {
    if (CVar1 == kValid) {
      if ((this->ConvolutionPaddingType_).valid_ != (ValidPadding *)0x0) {
        (*(((this->ConvolutionPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((CVar1 == kSame) && ((this->ConvolutionPaddingType_).valid_ != (ValidPadding *)0x0)) {
      (*(((this->ConvolutionPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ConvolutionLayerParams::clear_ConvolutionPaddingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ConvolutionLayerParams)
  switch (ConvolutionPaddingType_case()) {
    case kValid: {
      delete ConvolutionPaddingType_.valid_;
      break;
    }
    case kSame: {
      delete ConvolutionPaddingType_.same_;
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CONVOLUTIONPADDINGTYPE_NOT_SET;
}